

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Tracks::AddTrack(Tracks *this,Track *track,int32_t number)

{
  uint uVar1;
  Track **ppTVar2;
  long lVar3;
  uint uVar4;
  Track **ppTVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  
  if (number < 0) {
LAB_0011cfd3:
    bVar9 = false;
  }
  else {
    bVar9 = false;
    if ((number < 0x7f) && (bVar9 = false, this->wrote_tracks_ == false)) {
      if ((number != 0) && (this->track_entries_size_ != 0)) {
        lVar7 = 0;
        do {
          if (this->track_entries_[lVar7]->number_ == (ulong)(uint)number) goto LAB_0011cfd3;
          lVar7 = lVar7 + 1;
        } while (this->track_entries_size_ != (uint32_t)lVar7);
      }
      uVar1 = this->track_entries_size_;
      uVar4 = uVar1 + 1;
      ppTVar5 = (Track **)operator_new__((ulong)uVar4 * 8,(nothrow_t *)&std::nothrow);
      bVar9 = ppTVar5 != (Track **)0x0;
      if (bVar9) {
        if ((ulong)uVar1 != 0) {
          ppTVar2 = this->track_entries_;
          uVar6 = 0;
          do {
            ppTVar5[uVar6] = ppTVar2[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        if (this->track_entries_ != (Track **)0x0) {
          operator_delete__(this->track_entries_);
        }
        if (number == 0) {
          uVar1 = this->track_entries_size_;
          number = uVar4;
          do {
            bVar8 = uVar1 != 0;
            if (uVar1 != 0) {
              if ((*ppTVar5)->number_ != (ulong)(uint)number) {
                lVar7 = 0;
                do {
                  if (uVar1 - 1 == (int)lVar7) {
                    bVar8 = false;
                    goto LAB_0011cfb8;
                  }
                  lVar3 = lVar7 + 1;
                  lVar7 = lVar7 + 1;
                } while (ppTVar5[lVar3]->number_ != (ulong)(uint)number);
                bVar8 = (uint)lVar7 < uVar1;
              }
              number = number + 1;
            }
LAB_0011cfb8:
          } while (bVar8);
        }
        track->number_ = (ulong)(uint)number;
        this->track_entries_ = ppTVar5;
        ppTVar5[this->track_entries_size_] = track;
        this->track_entries_size_ = uVar4;
      }
    }
  }
  return bVar9;
}

Assistant:

bool Tracks::AddTrack(Track* track, int32_t number) {
  if (number < 0 || wrote_tracks_)
    return false;

  // This muxer only supports track numbers in the range [1, 126], in
  // order to be able (to use Matroska integer representation) to
  // serialize the block header (of which the track number is a part)
  // for a frame using exactly 4 bytes.

  if (number > 0x7E)
    return false;

  uint32_t track_num = number;

  if (track_num > 0) {
    // Check to make sure a track does not already have |track_num|.
    for (uint32_t i = 0; i < track_entries_size_; ++i) {
      if (track_entries_[i]->number() == track_num)
        return false;
    }
  }

  const uint32_t count = track_entries_size_ + 1;

  Track** const track_entries = new (std::nothrow) Track*[count];  // NOLINT
  if (!track_entries)
    return false;

  for (uint32_t i = 0; i < track_entries_size_; ++i) {
    track_entries[i] = track_entries_[i];
  }

  delete[] track_entries_;

  // Find the lowest availible track number > 0.
  if (track_num == 0) {
    track_num = count;

    // Check to make sure a track does not already have |track_num|.
    bool exit = false;
    do {
      exit = true;
      for (uint32_t i = 0; i < track_entries_size_; ++i) {
        if (track_entries[i]->number() == track_num) {
          track_num++;
          exit = false;
          break;
        }
      }
    } while (!exit);
  }
  track->set_number(track_num);

  track_entries_ = track_entries;
  track_entries_[track_entries_size_] = track;
  track_entries_size_ = count;
  return true;
}